

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O2

void __thiscall
kratos::Simulator::process_stmt(Simulator *this,SequentialStmtBlock *block,Var *var_)

{
  EventEdgeType EVar1;
  pointer pEVar2;
  _Hash_node_base var;
  EventControl *event;
  pointer pEVar3;
  __node_base *p_Var4;
  bool bVar5;
  optional<unsigned_long> oVar6;
  _Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_58;
  SequentialStmtBlock *local_38;
  
  pEVar3 = (block->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar2 = (block->conditions_).
           super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_38 = block;
  do {
    if (pEVar3 == pEVar2) {
      return;
    }
    if (pEVar3->var == var_) {
      EVar1 = pEVar3->edge;
      oVar6 = get_value_(this,pEVar3->var);
      if (EVar1 == Posedge) {
        bVar5 = oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_payload != 0;
      }
      else {
        bVar5 = oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_payload == 0;
      }
      if ((oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_engaged & bVar5) != 0) {
        process_stmt(this,&local_38->super_StmtBlock,var_);
        p_Var4 = &(this->nba_values_)._M_h._M_before_begin;
        while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
          var._M_nxt = p_Var4[1]._M_nxt;
          std::_Optional_payload_base<std::vector<unsigned_long,std::allocator<unsigned_long>>>::
          _Optional_payload_base<std::vector<unsigned_long,std::allocator<unsigned_long>>const&>
                    ((_Optional_payload_base<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                      *)&local_58,(_Prime_rehash_policy *)(p_Var4 + 2));
          set_complex_value_(this,(Var *)var._M_nxt,
                             (optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              *)&local_58);
          std::_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
          _M_reset(&local_58);
        }
        std::
        _Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::clear(&(this->nba_values_)._M_h);
        return;
      }
    }
    pEVar3 = pEVar3 + 1;
  } while( true );
}

Assistant:

void Simulator::process_stmt(kratos::SequentialStmtBlock *block, const Var *var_) {
    // only trigger it if it's actually high/low
    auto const &conditions = block->get_event_controls();
    bool trigger = false;
    for (auto const &event : conditions) {
        if (event.var != var_) continue;
        if (event.edge == EventEdgeType::Posedge) {
            auto val = get_value_(event.var);
            if (val && *val) {
                trigger = true;
                break;
            }
        } else {
            auto val = get_value_(event.var);
            if (val && (!(*val))) {
                trigger = true;
                break;
            }
        }
    }
    if (!trigger) return;
    process_stmt(reinterpret_cast<StmtBlock *>(block), var_);

    for (auto const &[var, value] : nba_values_) {
        set_complex_value_(var, value);
    }
    // clear the nba regions
    nba_values_.clear();
}